

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::PolyKernel::ByteSizeLong(PolyKernel *this)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  
  uVar1 = (ulong)(-(uint)(this->c_ != 0.0) & 1);
  sVar2 = uVar1 * 9 + 9;
  sVar3 = uVar1 * 9;
  if (this->gamma_ != 0.0) {
    sVar3 = sVar2;
  }
  if (NAN(this->gamma_)) {
    sVar3 = sVar2;
  }
  if (this->degree_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->degree_);
    sVar3 = sVar3 + sVar2 + 1;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t PolyKernel::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.PolyKernel)
  size_t total_size = 0;

  // double c = 2;
  if (this->c() != 0) {
    total_size += 1 + 8;
  }

  // double gamma = 3;
  if (this->gamma() != 0) {
    total_size += 1 + 8;
  }

  // int32 degree = 1;
  if (this->degree() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->degree());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}